

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Type.cxx
# Opt level: O3

void __thiscall Fl_Type::write_properties(Fl_Type *this)

{
  int iVar1;
  
  if (this->label_ != (char *)0x0) {
    write_indent(this->level + 1);
    write_word("label");
    write_word(this->label_);
  }
  if (this->user_data_ != (char *)0x0) {
    write_indent(this->level + 1);
    write_word("user_data");
    write_word(this->user_data_);
  }
  if (this->user_data_type_ != (char *)0x0) {
    write_word("user_data_type");
    write_word(this->user_data_type_);
  }
  if (this->callback_ != (char *)0x0) {
    write_indent(this->level + 1);
    write_word("callback");
    write_word(this->callback_);
  }
  if (this->comment_ != (char *)0x0) {
    write_indent(this->level + 1);
    write_word("comment");
    write_word(this->comment_);
  }
  iVar1 = (*this->_vptr_Fl_Type[0x16])(this);
  if ((iVar1 != 0) && (this->open_ != '\0')) {
    write_word("open");
  }
  if (this->selected != '\0') {
    write_word("selected");
    return;
  }
  return;
}

Assistant:

void Fl_Type::write_properties() {
  // repeat this for each attribute:
  if (label()) {
    write_indent(level+1);
    write_word("label");
    write_word(label());
  }
  if (user_data()) {
    write_indent(level+1);
    write_word("user_data");
    write_word(user_data());
  }
  if (user_data_type()) {
    write_word("user_data_type");
    write_word(user_data_type());
  }
  if (callback()) {
    write_indent(level+1);
    write_word("callback");
    write_word(callback());
  }
  if (comment()) {
    write_indent(level+1);
    write_word("comment");
    write_word(comment());
  }
  if (is_parent() && open_) write_word("open");
  if (selected) write_word("selected");
}